

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_init_default(nk_text_edit *state)

{
  nk_text_edit *state_local;
  
  if (state == (nk_text_edit *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x364a,"void nk_textedit_init_default(struct nk_text_edit *)");
  }
  if (state != (nk_text_edit *)0x0) {
    nk_memset(state,0,0x1508);
    nk_textedit_clear_state(state,NK_TEXT_EDIT_SINGLE_LINE,(nk_plugin_filter)0x0);
    nk_str_init_default(&state->string);
  }
  return;
}

Assistant:

NK_API void
nk_textedit_init_default(struct nk_text_edit *state)
{
    NK_ASSERT(state);
    if (!state) return;
    NK_MEMSET(state, 0, sizeof(struct nk_text_edit));
    nk_textedit_clear_state(state, NK_TEXT_EDIT_SINGLE_LINE, 0);
    nk_str_init_default(&state->string);
}